

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O0

int32_t uloc_kw_countKeywords(UEnumeration *en,UErrorCode *param_2)

{
  size_t sVar1;
  int local_24;
  char *pcStack_20;
  int32_t result;
  char *kw;
  UErrorCode *param_1_local;
  UEnumeration *en_local;
  
  pcStack_20 = *en->context;
  local_24 = 0;
  for (; *pcStack_20 != '\0'; pcStack_20 = pcStack_20 + sVar1 + 1) {
    local_24 = local_24 + 1;
    sVar1 = strlen(pcStack_20);
  }
  return local_24;
}

Assistant:

static int32_t U_CALLCONV
uloc_kw_countKeywords(UEnumeration *en, UErrorCode * /*status*/) {
    char *kw = ((UKeywordsContext *)en->context)->keywords;
    int32_t result = 0;
    while(*kw) {
        result++;
        kw += uprv_strlen(kw)+1;
    }
    return result;
}